

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,FabOnDisk *fod)

{
  ostream *poVar1;
  ulong uVar2;
  string *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,TheFabOnDiskPrefix);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,' ');
  std::ostream::operator<<(poVar1,*(long *)(in_RSI + 0x20));
  uVar2 = std::ios::good();
  if ((uVar2 & 1) == 0) {
    Error_host((char *)fod);
  }
  return in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const VisMF::FabOnDisk& fod)
{
    os << TheFabOnDiskPrefix << ' ' << fod.m_name << ' ' << fod.m_head;

    if( ! os.good()) {
        amrex::Error("Write of VisMF::FabOnDisk failed");
    }

    return os;
}